

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void * __thiscall
google::protobuf::Arena::
AllocateInternal<google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>,true>
          (Arena *this)

{
  void *pvVar1;
  Arena *this_local;
  
  pvVar1 = AllocateAligned(this,0x18,8);
  return pvVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE void* PROTOBUF_NONNULL AllocateInternal() {
    if (trivial) {
      return AllocateAligned(sizeof(T), alignof(T));
    } else {
      // We avoid instantiating arena_destruct_object<T> in the trivial case.
      constexpr auto dtor = &internal::cleanup::arena_destruct_object<
          std::conditional_t<trivial, std::string, T>>;
      return AllocateAlignedWithCleanup(sizeof(T), alignof(T), dtor);
    }
  }